

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::GeneratedCodeInfo_Annotation
          (GeneratedCodeInfo_Annotation *this,Arena *arena,bool is_message_owned)

{
  bool is_message_owned_local;
  Arena *arena_local;
  GeneratedCodeInfo_Annotation *this_local;
  
  Message::Message(&this->super_Message,arena,is_message_owned);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__GeneratedCodeInfo_Annotation_008eb778;
  internal::HasBits<1UL>::HasBits(&this->_has_bits_);
  internal::CachedSize::CachedSize(&this->_cached_size_);
  RepeatedField<int>::RepeatedField(&this->path_,arena);
  SharedCtor(this);
  if (!is_message_owned) {
    RegisterArenaDtor(this,arena);
  }
  return;
}

Assistant:

GeneratedCodeInfo_Annotation::GeneratedCodeInfo_Annotation(::PROTOBUF_NAMESPACE_ID::Arena* arena,
                         bool is_message_owned)
  : ::PROTOBUF_NAMESPACE_ID::Message(arena, is_message_owned),
  path_(arena) {
  SharedCtor();
  if (!is_message_owned) {
    RegisterArenaDtor(arena);
  }
  // @@protoc_insertion_point(arena_constructor:google.protobuf.GeneratedCodeInfo.Annotation)
}